

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trivialre_test.cc
# Opt level: O2

void __thiscall TrivialRETest_Compilations_Test::TestBody(TrivialRETest_Compilations_Test *this)

{
  AssertHelper *this_00;
  pointer *__return_storage_ptr__;
  size_t sVar1;
  string_view str;
  Message *message;
  char *message_00;
  undefined1 auVar2 [8];
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
  __l;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_208;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_1e8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_1c8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_1a8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_188;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_168;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_148;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_128;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_108;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_e8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_c8;
  undefined1 local_a0 [8];
  vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  cases;
  string got;
  undefined8 uStack_58;
  AssertionResult gtest_ar;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_38;
  
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::pair<const_char_(&)[22],_const_char_(&)[58],_true>
            (&local_208,(char (*) [22])"mis.*being deal.*free",
             (char (*) [58])"(seq \'mis\' (star <dot>) \'being deal\' (star <dot>) \'free\')");
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::pair<const_char_(&)[24],_const_char_(&)[66],_true>
            (&local_1e8,(char (*) [24])"mis.*(being|deal).*free",
             (char (*) [66])
             "(seq \'mis\' (star <dot>) (alt \'being\' \'deal\') (star <dot>) \'free\')");
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::pair<const_char_(&)[24],_const_char_(&)[73],_true>
            (&local_1c8,(char (*) [24])"mis.*(being|deal)*fre*e",
             (char (*) [73])
             "(seq \'mis\' (star <dot>) (star (alt \'being\' \'deal\')) \'fr\' (star \'e\') \'e\')")
  ;
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::pair<const_char_(&)[24],_const_char_(&)[87],_true>
            (&local_1a8,(char (*) [24])"mis.*(being|deal)+?free",
             (char (*) [87])
             "(seq \'mis\' (star <dot>) (seq (alt \'being\' \'deal\') (star (alt \'being\' \'deal\'))) \'free\')"
            );
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::pair<const_char_(&)[24],_const_char_(&)[72],_true>
            (&local_188,(char (*) [24])"mis.*(being|deal)?fre*e",
             (char (*) [72])
             "(seq \'mis\' (star <dot>) (alt <any> \'being\' \'deal\') \'fr\' (star \'e\') \'e\')");
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::pair<const_char_(&)[22],_const_char_(&)[72],_true>
            (&local_168,(char (*) [22])"mis.*being|deal.*free",
             (char (*) [72])
             "(alt (seq \'mis\' (star <dot>) \'being\') (seq \'deal\' (star <dot>) \'free\'))");
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::pair<const_char_(&)[23],_const_char_(&)[72],_true>
            (&local_148,(char (*) [23])"mis.*?being|deal.*free",
             (char (*) [72])
             "(alt (seq \'mis\' (star <dot>) \'being\') (seq \'deal\' (star <dot>) \'free\'))");
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::pair<const_char_(&)[3],_const_char_(&)[4],_true>
            (&local_128,(char (*) [3])"\\*",(char (*) [4])"\'*\'");
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::pair<const_char_(&)[3],_const_char_(&)[4],_true>
            (&local_108,(char (*) [3])"\\|",(char (*) [4])"\'|\'");
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[18],_true>
            (&local_e8,(char (*) [2])0x1339e5,(char (*) [18])"(alt <any> <any>)");
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::pair<const_char_(&)[5],_const_char_(&)[30],_true>
            (&local_c8,(char (*) [5])"(|)|",(char (*) [30])"(alt (alt <any> <any>) <any>)");
  __l._M_len = 0xb;
  __l._M_array = &local_208;
  std::
  vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  ::vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
            *)local_a0,__l,
           (allocator_type *)
           &cases.
            super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage);
  puts("--- test cases ---");
  this_00 = (AssertHelper *)(&got.field_2._M_allocated_capacity + 1);
  for (auVar2 = local_a0;
      auVar2 != (undefined1  [8])
                cases.
                super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      auVar2 = (undefined1  [8])((long)auVar2 + 0x20)) {
    sVar1 = (((pointer)auVar2)->first)._M_len;
    local_208.first._M_str = (((pointer)auVar2)->first)._M_str;
    str._M_len = (((pointer)auVar2)->first)._M_len;
    str._M_str = (((pointer)auVar2)->first)._M_str;
    local_208.second._M_len = (((pointer)auVar2)->second)._M_len;
    local_208.second._M_str = (((pointer)auVar2)->second)._M_str;
    local_208.first._M_len._0_4_ = (uint)sVar1;
    local_208.first._M_len._4_4_ = (undefined4)(sVar1 >> 0x20);
    uStack_58 = 0;
    gtest_ar.success_ = false;
    gtest_ar._1_7_ = 0;
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )&local_38;
    __return_storage_ptr__ =
         &cases.
          super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
    trivialre::re_compiler::C<StringTestingBuilder,trivialre::re_compiler::ErrorPolicy>::
    CompileOrDie_abi_cxx11_
              ((Matcher *)__return_storage_ptr__,
               (C<StringTestingBuilder,trivialre::re_compiler::ErrorPolicy> *)&uStack_58,str);
    printf("test: /%.*s/ -> %s\n",(ulong)(uint)local_208.first._M_len,local_208.first._M_str,
           cases.
           super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::internal::
    CmpHelperEQ<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>
              ((internal *)&uStack_58,"expected","got",&local_208.second,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__);
    if (uStack_58._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_38);
      std::operator<<((ostream *)(local_38._M_head_impl + 0x10),"re: ");
      message = testing::Message::operator<<((Message *)&local_38,&local_208.first);
      message_00 = "";
      if (gtest_ar._0_8_ != 0) {
        message_00 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (this_00,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/benchmark/trivialre_test.cc"
                 ,0x6e,message_00);
      testing::internal::AssertHelper::operator=(this_00,message);
      testing::internal::AssertHelper::~AssertHelper(this_00);
      if (local_38._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_38._M_head_impl + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&gtest_ar);
    std::__cxx11::string::~string
              ((string *)
               &cases.
                super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::
  _Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  ::~_Vector_base((_Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                   *)local_a0);
  return;
}

Assistant:

TEST(TrivialRETest, Compilations) {
  // format is {regex, golden-parsing}
  std::vector<std::pair<std::string_view, std::string_view>> cases = {
      {"mis.*being deal.*free", "(seq 'mis' (star <dot>) 'being deal' (star <dot>) 'free')"},
      {"mis.*(being|deal).*free", "(seq 'mis' (star <dot>) (alt 'being' 'deal') (star <dot>) 'free')"},
      {"mis.*(being|deal)*fre*e", "(seq 'mis' (star <dot>) (star (alt 'being' 'deal')) 'fr' (star 'e') 'e')"},
      {"mis.*(being|deal)+?free", "(seq 'mis' (star <dot>) (seq (alt 'being' 'deal') (star (alt 'being' 'deal'))) 'free')"},
      {"mis.*(being|deal)?fre*e", "(seq 'mis' (star <dot>) (alt <any> 'being' 'deal') 'fr' (star 'e') 'e')"},
      {"mis.*being|deal.*free",
       "(alt (seq 'mis' (star <dot>) 'being') (seq 'deal' (star <dot>) "
       "'free'))"},
      {"mis.*?being|deal.*free", "(alt (seq 'mis' (star <dot>) 'being') (seq 'deal' (star <dot>) 'free'))"},
      {"\\*", "'*'"},
      {"\\|", "'|'"},
      {"|", "(alt <any> <any>)"},
      {"(|)|", "(alt (alt <any> <any>) <any>)"},
  };

  printf("--- test cases ---\n");
  for (auto [re, expected] : cases) {
    std::string got = trivialre::re_compiler::C<StringTestingBuilder>{StringTestingBuilder{}}.CompileOrDie(re);
    printf("test: /%.*s/ -> %s\n", int(re.size()), re.data(), got.c_str());
    EXPECT_EQ(expected, got) << "re: " << re;
  }
}